

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

ZSTD_CCtx * duckdb_zstd::ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_cwksp *ws;
  void *__s;
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  long lVar3;
  ZSTD_cwksp *pZVar4;
  ZSTD_cwksp *pZVar5;
  byte bVar6;
  ZSTD_cpuid_t ZVar7;
  ZSTD_cwksp ZStack_68;
  
  bVar6 = 0;
  if (((ulong)workspace & 7) == 0 && 0x1480 < workspaceSize) {
    ZSTD_cwksp_init(&ZStack_68,workspace,workspaceSize,ZSTD_cwksp_static_alloc);
    __s = ZStack_68.objectEnd;
    if (ZStack_68.phase != ZSTD_cwksp_alloc_objects) {
      return (ZSTD_CCtx *)0x0;
    }
    ZStack_68.tableEnd = (void *)((long)ZStack_68.objectEnd + 0x1480);
    if (ZStack_68.workspaceEnd < ZStack_68.tableEnd) {
      return (ZSTD_CCtx *)0x0;
    }
    if ((ZSTD_CCtx *)ZStack_68.objectEnd != (ZSTD_CCtx *)0x0) {
      ZStack_68.objectEnd = ZStack_68.tableEnd;
      ZStack_68.tableValidEnd = ZStack_68.tableEnd;
      switchD_016d8eb1::default(__s,0,0x1480);
      ws = (ZSTD_cwksp *)((long)__s + 0x2a8);
      pZVar4 = &ZStack_68;
      pZVar5 = ws;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        pZVar5->workspace = pZVar4->workspace;
        pZVar4 = (ZSTD_cwksp *)((long)pZVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pZVar5 = (ZSTD_cwksp *)((long)pZVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      *(size_t *)((long)__s + 0x388) = workspaceSize;
      if ((ulong)((long)((ZSTD_cwksp *)((long)__s + 0x2a8))->allocStart -
                 (long)((ZSTD_cwksp *)((long)__s + 0x2a8))->tableEnd) < 0x4ed8) {
        return (ZSTD_CCtx *)0x0;
      }
      pZVar1 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
      ((ZSTD_blockState_t *)((long)__s + 0xc80))->prevCBlock = pZVar1;
      pZVar1 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
      ((ZSTD_blockState_t *)((long)__s + 0xc80))->nextCBlock = pZVar1;
      pUVar2 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
      *(U32 **)((long)__s + 0xdc0) = pUVar2;
      ZVar7 = ZSTD_cpuid();
      *(U32 *)((long)__s + 8) = ZVar7.f1c >> 8 & 1;
      return (ZSTD_CCtx *)__s;
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}